

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_as_json_dbpointer(void)

{
  byte bVar1;
  int iVar2;
  undefined1 local_30 [8];
  size_t len;
  char *str;
  bson_t *b;
  bson_oid_t oid;
  
  bson_oid_init_from_string((long)&b + 4,"12341234123412abcdababcd");
  str = (char *)bson_new();
  bVar1 = bson_append_dbpointer(str,"dbpointer",0xffffffff,"collection",(long)&b + 4);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x265,"test_bson_as_json_dbpointer",
            "bson_append_dbpointer (b, \"dbpointer\", -1, \"collection\", &oid)");
    abort();
  }
  bVar1 = bson_append_dbpointer(str,"escaping",0xffffffff,"\"coll\"",(long)&b + 4);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x266,"test_bson_as_json_dbpointer",
            "bson_append_dbpointer (b, \"escaping\", -1, \"\\\"coll\\\"\", &oid)");
    abort();
  }
  len = bson_as_json(str,local_30);
  if ((char *)len !=
      "{ \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" : \"12341234123412abcdababcd\" }, \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" : \"12341234123412abcdababcd\" } }"
     ) {
    iVar2 = strcmp((char *)len,
                   "{ \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" : \"12341234123412abcdababcd\" }, \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" : \"12341234123412abcdababcd\" } }"
                  );
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",len,
              "{ \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" : \"12341234123412abcdababcd\" }, \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" : \"12341234123412abcdababcd\" } }"
             );
      abort();
    }
  }
  bson_free(len);
  bson_destroy(str);
  return;
}

Assistant:

static void
test_bson_as_json_dbpointer (void)
{
   bson_oid_t oid;
   bson_t *b;
   char *str;
   size_t len;

   bson_oid_init_from_string (&oid, "12341234123412abcdababcd");

   b = bson_new ();
   BSON_ASSERT (bson_append_dbpointer (b, "dbpointer", -1, "collection", &oid));
   BSON_ASSERT (bson_append_dbpointer (b, "escaping", -1, "\"coll\"", &oid));
   str = bson_as_json (b, &len);

   ASSERT_CMPSTR (str,
                  "{"
                  " \"dbpointer\" : { \"$ref\" : \"collection\", \"$id\" "
                  ": \"12341234123412abcdababcd\" },"
                  " \"escaping\" : { \"$ref\" : \"\\\"coll\\\"\", \"$id\" "
                  ": \"12341234123412abcdababcd\" } }");

   bson_free (str);
   bson_destroy (b);
}